

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

Bool prvTidyIsValidXMLID(ctmbstr id)

{
  byte bVar1;
  uint uVar2;
  Bool BVar3;
  byte *str;
  tchar c;
  uint local_1c;
  
  if (id != (ctmbstr)0x0) {
    local_1c = (uint)*id;
    str = (byte *)(id + 1);
    if (*id < '\0') {
      uVar2 = prvTidyGetUTF8((ctmbstr)str,&local_1c);
      str = str + uVar2;
    }
    BVar3 = prvTidyIsXMLLetter(local_1c);
    if (((BVar3 != no) || (local_1c == 0x5f)) || (local_1c == 0x3a)) {
      do {
        bVar1 = *str;
        if (bVar1 == 0) {
          return yes;
        }
        local_1c = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar2 = prvTidyGetUTF8((ctmbstr)str,&local_1c);
          str = str + uVar2;
        }
        str = str + 1;
        BVar3 = prvTidyIsXMLNamechar(local_1c);
      } while (BVar3 != no);
    }
  }
  return no;
}

Assistant:

Bool TY_(IsValidXMLID)(ctmbstr id)
{
    ctmbstr s = id;
    tchar c;

    if (!s)
        return no;

    c = *s++;
    if (c > 0x7F)
        s += TY_(GetUTF8)(s, &c);

    if (!(TY_(IsXMLLetter)(c) || c == '_' || c == ':'))
        return no;

    while (*s)
    {
        c = (unsigned char)*s;

        if (c > 0x7F)
            s += TY_(GetUTF8)(s, &c);

        ++s;

        if (!TY_(IsXMLNamechar)(c))
            return no;
    }

    return yes;
}